

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall cfd::core::TapBranch::AddBranch(TapBranch *this,TapBranch *branch)

{
  CfdException *this_00;
  allocator local_39;
  string local_38;
  
  ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
  emplace_back<cfd::core::TapBranch_const&>
            ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
             &this->branch_list_,branch);
  if ((ulong)(((long)(this->branch_list_).
                     super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->branch_list_).
                    super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x78) < 0x81) {
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_38,"tapbranch maximum over.",&local_39);
  CfdException::CfdException(this_00,kCfdIllegalStateError,&local_38);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void TapBranch::AddBranch(const TapBranch& branch) {
  branch_list_.emplace_back(branch);
  if (branch_list_.size() > TaprootScriptTree::kTaprootControlMaxNodeCount) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "tapbranch maximum over.");
  }
}